

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O0

void device_init(char *cfg)

{
  ISPCScene *in_stack_00000010;
  TutorialData *in_stack_00000028;
  
  embree::TutorialData_Constructor(in_stack_00000028);
  embree::g_scene = embree::convertScene(in_stack_00000010);
  embree::data = embree::g_scene;
  _DAT_0060d428 = rtcGetSceneTraversable(embree::g_scene);
  return;
}

Assistant:

void device_init (char* cfg)
{
  TutorialData_Constructor(&data);
  
  /* create scene */
  g_scene = data.scene = convertScene(data.ispc_scene);
  data.traversable = rtcGetSceneTraversable(data.scene);
}